

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void sha1ni(void *key,int len,uint32_t seed,void *out)

{
  uint uVar1;
  void *__dest;
  ulong *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void *in_RDI;
  uint8_t *padded_1;
  uint32_t lenpadded;
  uint8_t padded [64];
  uint32_t state [5];
  undefined1 local_78 [4];
  uint32_t in_stack_ffffffffffffff8c;
  uint8_t *in_stack_ffffffffffffff90;
  uint32_t *in_stack_ffffffffffffff98;
  ulong local_38;
  
  local_38 = CONCAT44(0xefcdab89,in_EDX) ^ 0x67452301;
  if (in_ESI < 0x40) {
    memcpy(local_78,in_RDI,(long)in_ESI);
    memset(local_78 + in_ESI,0,(long)(0x40 - in_ESI));
    sha1_process_x86(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  else if (in_ESI % 0x40 == 0) {
    sha1_process_x86(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  else {
    uVar1 = in_ESI + (0x40 - in_ESI % 0x40);
    __dest = malloc((ulong)uVar1);
    memcpy(__dest,in_RDI,(long)in_ESI);
    memset((void *)((long)__dest + (long)in_ESI),0,(ulong)(uVar1 - in_ESI));
    sha1_process_x86(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    free(__dest);
  }
  *in_RCX = local_38;
  in_RCX[1] = 0x1032547698badcfe;
  *(undefined4 *)(in_RCX + 2) = 0xc3d2e1f0;
  return;
}

Assistant:

inline void sha1ni(const void *key, int len, uint32_t seed, void *out)
{
  // objsize: 0x2c1 + this (0x408bac - 0x408a90) = 989
  uint32_t state[5] = {0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0};
  state[0] = 0x67452301U ^ seed;
  if (len < 64) {
    uint8_t padded[64];
    memcpy (padded, key, len);
    memset (&padded[len], 0, 64-len);
    sha1_process_x86(state, (const uint8_t*)padded, 64);
  } else if (len % 64) {
    uint32_t lenpadded = len + (64 - len % 64);
    uint8_t *padded = (uint8_t*)malloc (lenpadded);
    memcpy (padded, key, len);
    memset (&padded[len], 0, lenpadded-len);
    sha1_process_x86(state, (const uint8_t*)padded, lenpadded);
    free (padded);
  } else {
    sha1_process_x86(state, (const uint8_t*)key, (uint32_t)len);
  }
  memcpy(out, state, 20);
}